

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall
Rml::DataViewCommon::DataViewCommon
          (DataViewCommon *this,Element *element,String *override_modifier,int sort_offset)

{
  int sort_offset_local;
  String *override_modifier_local;
  Element *element_local;
  DataViewCommon *this_local;
  
  DataView::DataView(&this->super_DataView,element,sort_offset);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_00815408;
  ::std::__cxx11::string::string((string *)&this->modifier,(string *)override_modifier);
  ::std::unique_ptr<Rml::DataExpression,std::default_delete<Rml::DataExpression>>::
  unique_ptr<std::default_delete<Rml::DataExpression>,void>
            ((unique_ptr<Rml::DataExpression,std::default_delete<Rml::DataExpression>> *)
             &this->expression);
  return;
}

Assistant:

DataViewCommon::DataViewCommon(Element* element, String override_modifier, int sort_offset) :
	DataView(element, sort_offset), modifier(std::move(override_modifier))
{}